

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QItemSelectionRange __thiscall
QItemSelectionRange::intersected(QItemSelectionRange *this,QItemSelectionRange *other)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemModel *pQVar2;
  uint *puVar3;
  QPersistentModelIndexData *extraout_RDX;
  QPersistentModelIndexData *extraout_RDX_00;
  QPersistentModelIndex QVar4;
  QPersistentModelIndexData *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionRange QVar5;
  QModelIndex bottomRight;
  QModelIndex topLeft;
  QModelIndex *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar6;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar9;
  QPersistentModelIndex this_00;
  bool local_d1;
  undefined1 local_b8 [24];
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d = in_RDI;
  pQVar1 = model((QItemSelectionRange *)0x8245d7);
  pQVar2 = model((QItemSelectionRange *)0x8245e6);
  local_d1 = false;
  if (pQVar1 == pQVar2) {
    parent((QItemSelectionRange *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    parent((QItemSelectionRange *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_d1 = ::operator==((QModelIndex *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffee8);
  }
  if (local_d1 == false) {
    memset(in_RDI,0,0x10);
    QItemSelectionRange((QItemSelectionRange *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QVar4.d = extraout_RDX_00;
  }
  else {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = model((QItemSelectionRange *)0x82467a);
    local_54 = top((QItemSelectionRange *)0x824688);
    local_58 = top((QItemSelectionRange *)0x824699);
    puVar3 = (uint *)qMax<int>(&local_54,&local_58);
    uVar6 = *puVar3;
    local_5c = left((QItemSelectionRange *)0x8246c5);
    local_60 = left((QItemSelectionRange *)0x8246d6);
    puVar3 = (uint *)qMax<int>(&local_5c,&local_60);
    uVar7 = *puVar3;
    parent((QItemSelectionRange *)CONCAT44(uVar7,uVar6));
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_50,pQVar1,(ulong)uVar6,(ulong)uVar7,local_78);
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = model((QItemSelectionRange *)0x824763);
    local_94 = bottom((QItemSelectionRange *)0x824772);
    local_98 = bottom((QItemSelectionRange *)0x824783);
    puVar3 = (uint *)qMin<int>(&local_94,&local_98);
    uVar8 = *puVar3;
    local_9c = right((QItemSelectionRange *)0x8247af);
    local_a0 = right((QItemSelectionRange *)0x8247bd);
    puVar3 = (uint *)qMin<int>(&local_9c,&local_a0);
    uVar9 = *puVar3;
    parent((QItemSelectionRange *)CONCAT44(uVar7,uVar6));
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_90,pQVar1,(ulong)uVar8,(ulong)uVar9,local_b8);
    QItemSelectionRange((QItemSelectionRange *)this_00.d,&in_RDI->index,
                        (QModelIndex *)CONCAT44(uVar9,uVar8));
    QVar4.d = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar5.br.d = QVar4.d;
    QVar5.tl.d = this_00.d;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelectionRange QItemSelectionRange::intersected(const QItemSelectionRange &other) const
{
    if (model() == other.model() && parent() == other.parent()) {
        QModelIndex topLeft = model()->index(qMax(top(), other.top()),
                                             qMax(left(), other.left()),
                                             other.parent());
        QModelIndex bottomRight = model()->index(qMin(bottom(), other.bottom()),
                                                 qMin(right(), other.right()),
                                                 other.parent());
        return QItemSelectionRange(topLeft, bottomRight);
    }
    return QItemSelectionRange();
}